

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O0

void deqp::gles31::bb::anon_unknown_11::generateImmMatrixSrc
               (ostream *src,DataType basicType,int matrixStride,bool isRowMajor,void *valuePtr)

{
  char *pcVar1;
  ostream *poVar2;
  int extraout_EDX;
  int precision;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int local_8c;
  string local_68;
  float *local_48;
  deUint8 *compPtr;
  int local_38;
  int rowNdx;
  int colNdx;
  int numCols;
  int numRows;
  int compSize;
  void *valuePtr_local;
  int local_18;
  DataType DStack_14;
  bool isRowMajor_local;
  int matrixStride_local;
  DataType basicType_local;
  ostream *src_local;
  
  numCols = 4;
  _numRows = valuePtr;
  valuePtr_local._7_1_ = isRowMajor;
  local_18 = matrixStride;
  DStack_14 = basicType;
  _matrixStride_local = src;
  colNdx = glu::getDataTypeMatrixNumRows(basicType);
  rowNdx = glu::getDataTypeMatrixNumColumns(DStack_14);
  poVar2 = _matrixStride_local;
  pcVar1 = glu::getDataTypeName(DStack_14);
  poVar2 = std::operator<<(poVar2,pcVar1);
  std::operator<<(poVar2,"(");
  precision = extraout_EDX;
  for (local_38 = 0; local_38 < rowNdx; local_38 = local_38 + 1) {
    for (compPtr._4_4_ = 0; compPtr._4_4_ < colNdx; compPtr._4_4_ = compPtr._4_4_ + 1) {
      if ((valuePtr_local._7_1_ & 1) == 0) {
        local_8c = local_38 * local_18 + compPtr._4_4_ * 4;
      }
      else {
        local_8c = compPtr._4_4_ * local_18 + local_38 * 4;
      }
      local_48 = (float *)((long)_numRows + (long)local_8c);
      if ((0 < local_38) || (0 < compPtr._4_4_)) {
        std::operator<<(_matrixStride_local,", ");
        precision = extraout_EDX_00;
      }
      poVar2 = _matrixStride_local;
      de::floatToString_abi_cxx11_(&local_68,(de *)&DAT_00000001,*local_48,precision);
      std::operator<<(poVar2,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      precision = extraout_EDX_01;
    }
  }
  std::operator<<(_matrixStride_local,")");
  return;
}

Assistant:

void generateImmMatrixSrc (std::ostream& src, glu::DataType basicType, int matrixStride, bool isRowMajor, const void* valuePtr)
{
	DE_ASSERT(glu::isDataTypeMatrix(basicType));

	const int		compSize		= sizeof(deUint32);
	const int		numRows			= glu::getDataTypeMatrixNumRows(basicType);
	const int		numCols			= glu::getDataTypeMatrixNumColumns(basicType);

	src << glu::getDataTypeName(basicType) << "(";

	// Constructed in column-wise order.
	for (int colNdx = 0; colNdx < numCols; colNdx++)
	{
		for (int rowNdx = 0; rowNdx < numRows; rowNdx++)
		{
			const deUint8*	compPtr	= (const deUint8*)valuePtr + (isRowMajor ? rowNdx*matrixStride + colNdx*compSize
																				: colNdx*matrixStride + rowNdx*compSize);

			if (colNdx > 0 || rowNdx > 0)
				src << ", ";

			src << de::floatToString(*((const float*)compPtr), 1);
		}
	}

	src << ")";
}